

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_rectangle_rounded(rf_rec rec,float roundness,int segments,rf_color color)

{
  float y;
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  uchar y_00;
  uchar z;
  uchar x;
  int iVar3;
  ulong uVar4;
  long lVar5;
  rf_int k;
  long lVar6;
  uchar w;
  float x_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float x_01;
  float y_01;
  float fVar13;
  float local_110;
  float local_88 [9];
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  long local_40;
  ulong local_38;
  
  fVar11 = rec.width;
  fVar12 = rec.height;
  x_00 = rec.x;
  fVar10 = rec.y;
  if (((0.0 < roundness) && (1.0 <= fVar11)) && (1.0 <= fVar12)) {
    fVar13 = 1.0;
    if (roundness <= 1.0) {
      fVar13 = roundness;
    }
    fVar7 = fVar12;
    if (fVar11 <= fVar12) {
      fVar7 = fVar11;
    }
    fVar13 = fVar7 * fVar13 * 0.5;
    if (0.0 < fVar13) {
      uVar4 = (ulong)(uint)segments;
      y_00 = color.g;
      z = color.b;
      if (segments < 4) {
        fVar7 = -0.5 / fVar13 + 1.0;
        fVar7 = fVar7 * fVar7;
        fVar7 = acosf(fVar7 + fVar7 + -1.0);
        fVar7 = ceilf(6.2831855 / fVar7);
        uVar4 = 4;
        if (0 < (int)(fVar7 * 0.25)) {
          uVar4 = (ulong)(uint)(int)(fVar7 * 0.25);
        }
      }
      iVar3 = (int)uVar4;
      x_01 = x_00 + fVar13;
      fVar11 = fVar11 + x_00;
      fVar7 = fVar11 - fVar13;
      y_01 = fVar10 + fVar13;
      local_58 = fVar10 + fVar12;
      fVar12 = local_58 - fVar13;
      prVar1 = (rf__ctx->field_0).current_batch;
      lVar6 = prVar1->current_buffer;
      prVar2 = prVar1->vertex_buffers;
      local_88[0] = x_01;
      local_88[1] = y_01;
      local_88[2] = fVar7;
      local_88[3] = y_01;
      local_88[4] = fVar7;
      local_88[5] = fVar12;
      local_88[6] = x_01;
      local_88[7] = fVar12;
      local_88[8] = fVar10;
      fStack_64 = fVar10;
      fStack_60 = fVar10;
      fStack_5c = fVar10;
      fStack_54 = fVar10;
      fStack_50 = fVar10;
      fStack_4c = fVar10;
      if (prVar2[lVar6].elements_count * 4 <= prVar2[lVar6].v_counter + iVar3 * 0xc + 0x1e) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_TRIANGLES);
      local_40 = (long)iVar3;
      lVar6 = 0;
      x = color.r;
      w = color.a;
      local_38 = uVar4;
      do {
        if (0 < (int)local_38) {
          fVar10 = local_88[lVar6 * 2];
          y = local_88[lVar6 * 2 + 1];
          local_110 = (float)(&DAT_0017c400)[lVar6];
          lVar5 = local_40;
          do {
            rf_gfx_color4ub(x,y_00,z,w);
            rf_gfx_vertex3f(fVar10,y,((rf__ctx->field_0).current_batch)->current_depth);
            fVar8 = sinf(local_110 * 0.017453292);
            fVar9 = cosf(local_110 * 0.017453292);
            rf_gfx_vertex3f(fVar8 * fVar13 + fVar10,fVar9 * fVar13 + y,
                            ((rf__ctx->field_0).current_batch)->current_depth);
            local_110 = local_110 + 90.0 / (float)iVar3;
            fVar8 = sinf(local_110 * 0.017453292);
            fVar9 = cosf(local_110 * 0.017453292);
            rf_gfx_vertex3f(fVar8 * fVar13 + fVar10,fVar9 * fVar13 + y,
                            ((rf__ctx->field_0).current_batch)->current_depth);
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      rf_gfx_color4ub(x,y_00,z,w);
      rf_gfx_vertex3f(x_01,local_88[8],((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,local_88[8],((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,local_88[8],((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x,y_00,z,w);
      rf_gfx_vertex3f(fVar7,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar11,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar11,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar11,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x,y_00,z,w);
      rf_gfx_vertex3f(x_01,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,local_58,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,local_58,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,local_58,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x,y_00,z,w);
      rf_gfx_vertex3f(x_00,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_00,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_00,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_color4ub(x,y_00,z,w);
      rf_gfx_vertex3f(x_01,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(x_01,y_01,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(fVar7,fVar12,((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_end();
    }
    return;
  }
  rf_draw_rectangle_pro(rec,(rf_vec2)0x0,0.0,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded(rf_rec rec, float roundness, int segments, rf_color color)
{
    // Not a rounded rectangle
    if ((roundness <= 0.0f) || (rec.width < 1) || (rec.height < 1 ))
    {
        rf_draw_rectangle_pro(rec, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 4;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;

    /*  Quick sketch to make sense of all of this (there are 9 parts to draw, also mark the 12 points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                    P1
     *       ____________________
     *     /|                    |\
     *    /1|          2         |3\
     *P7 /__|____________________|__\ P2
     *  /   |                    |  _\ P2
     *  |   |P8                P9|   |
     *  | 8 |          9         | 4 |
     *  | __|____________________|__ |
     *P6 \  |P11              P10|  / P3
     *    \7|          6         |5/
     *     \|____________________|/
     *     P5                    P4
     */

    const rf_vec2 point[12] = { // coordinates of the 12 points that define the rounded rect (the idea here is to make things easier)
            {(float)rec.x + radius, rec.y}, {(float)(rec.x + rec.width) - radius, rec.y}, { rec.x + rec.width, (float)rec.y + radius }, // PO, P1, P2
            {rec.x + rec.width, (float)(rec.y + rec.height) - radius}, {(float)(rec.x + rec.width) - radius, rec.y + rec.height}, // P3, P4
            {(float)rec.x + radius, rec.y + rec.height}, { rec.x, (float)(rec.y + rec.height) - radius}, {rec.x, (float)rec.y + radius}, // P5, P6, P7
            {(float)rec.x + radius, (float)rec.y + radius}, {(float)(rec.x + rec.width) - radius, (float)rec.y + radius}, // P8, P9
            {(float)(rec.x + rec.width) - radius, (float)(rec.y + rec.height) - radius}, {(float)rec.x + radius, (float)(rec.y + rec.height) - radius} // P10, P11
    };

    const rf_vec2 centers[4] = {point[8], point[9], point[10], point[11] };
    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };
    if (rf_gfx_check_buffer_limit(12*segments + 5*6)) rf_gfx_draw(); // 4 corners with 3 vertices per segment + 5 rectangles with 6 vertices each

    rf_gfx_begin(RF_TRIANGLES);
    // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
    for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
    {
        float angle = angles[k];
        const rf_vec2 center = centers[k];
        for (rf_int i = 0; i < segments; i++)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(center.x, center.y);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
            rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);
            angle += step_length;
        }
    }

    // [2] Upper rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[1].x, point[1].y);
    rf_gfx_vertex2f(point[0].x, point[0].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);

    // [4] Right rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);
    rf_gfx_vertex2f(point[2].x, point[2].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[3].x, point[3].y);

    // [6] Bottom rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[5].x, point[5].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[4].x, point[4].y);

    // [8] Left rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[6].x, point[6].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[7].x, point[7].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);

    // [9] Middle rf_rec
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[11].x, point[11].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_vertex2f(point[9].x, point[9].y);
    rf_gfx_vertex2f(point[8].x, point[8].y);
    rf_gfx_vertex2f(point[10].x, point[10].y);
    rf_gfx_end();

}